

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_details::rrb_drop_left<char,false,5>
          (rrb_details *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t left)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  char *pcVar5;
  rrb<char,_false,_5> *prVar6;
  rrb<char,_false,_5> *prVar7;
  rrb<char,_false,_5> *prVar8;
  internal_node<char,_false> *piVar9;
  rrb_size_table<false> *prVar10;
  tree_node<char,_false> *ptVar11;
  leaf_node<char,_false> *plVar12;
  uint32_t i;
  ulong uVar13;
  uint uVar14;
  uint32_t i_1;
  uint32_t i_3;
  ref<immutable::rrb<char,_false,_5>_> new_rrb;
  ref<immutable::rrb_details::internal_node<char,_false>_> root;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  
  prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
  if (left < prVar6->cnt) {
    if (left != 0) {
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      uVar2 = prVar6->cnt;
      uVar14 = uVar2 - left;
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      if (uVar14 <= prVar6->tail_len) {
        new_rrb.ptr = (rrb<char,_false,_5> *)leaf_node_create<char,false>(uVar14);
        if (new_rrb.ptr != (rrb<char,_false,_5> *)0x0) {
          (new_rrb.ptr)->tail_len = 1;
        }
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar6->tail);
          pcVar5 = plVar12->child;
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          cVar1 = pcVar5[(left - uVar2) + (int)uVar13 + prVar6->tail_len];
          plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
          plVar12->child[uVar13] = cVar1;
        }
        rrb_create<char,false,5>();
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar6->cnt = uVar14;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar6->tail_len = uVar14;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&prVar6->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
        release<char>((leaf_node<char,_false> *)new_rrb.ptr);
        return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
      }
      rrb_create<char,false,5>();
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
      prVar7 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      prVar8 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      rrb_drop_left_rec<char,false,5>
                ((rrb_details *)&local_38,&prVar6->shift,&prVar7->root,left,prVar8->shift,false);
      root.ptr = (internal_node<char,_false> *)local_38.ptr;
      if ((internal_node<char,_false> *)local_38.ptr != (internal_node<char,_false> *)0x0) {
        (local_38.ptr)->_ref_count = (local_38.ptr)->_ref_count + 1;
      }
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
      prVar6->cnt = uVar14;
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
      ref<immutable::rrb_details::tree_node<char,false>>::operator=
                ((ref<immutable::rrb_details::tree_node<char,false>> *)&prVar6->root,&root);
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
      if ((prVar6->shift != 0) &&
         (piVar9 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&root),
         (piVar9->size_table).ptr != (rrb_size_table<false> *)0x0)) {
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
        uVar2 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        uVar3 = prVar6->tail_len;
        piVar9 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&root);
        prVar10 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                            (&piVar9->size_table);
        puVar4 = prVar10->size;
        piVar9 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&root);
        puVar4[piVar9->len - 1] = uVar2 - uVar3;
      }
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      prVar7 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
      ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&prVar7->tail,&prVar6->tail);
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      uVar2 = prVar6->tail_len;
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(&new_rrb);
      prVar6->tail_len = uVar2;
      ref<immutable::rrb<char,_false,_5>_>::operator=(in,&new_rrb);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&root);
      ref<immutable::rrb<char,_false,_5>_>::~ref(&new_rrb);
    }
    prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
    if ((prVar6->shift == 0) &&
       (prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in),
       (prVar6->root).ptr != (tree_node<char,_false> *)0x0)) {
      prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      if (prVar6->cnt < 0x21) {
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        new_rrb.ptr = (rrb<char,_false,_5> *)leaf_node_create<char,false>(prVar6->cnt);
        if (new_rrb.ptr != (rrb<char,_false,_5> *)0x0) {
          (new_rrb.ptr)->tail_len = 1;
        }
        uVar13 = 0;
        while( true ) {
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          ptVar11 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(&prVar6->root);
          if (ptVar11->len <= uVar13) break;
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          cVar1 = *(char *)(*(long *)((prVar6->root).ptr + 1) + uVar13);
          plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
          plVar12->child[uVar13] = cVar1;
          uVar13 = uVar13 + 1;
        }
        uVar13 = 0;
        while( true ) {
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          uVar14 = prVar6->tail_len;
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          if (uVar14 <= uVar13) break;
          plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar6->tail);
          cVar1 = plVar12->child[uVar13];
          plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                              ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
          pcVar5 = plVar12->child;
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          ptVar11 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(&prVar6->root);
          pcVar5[ptVar11->len + (int)uVar13] = cVar1;
          uVar13 = uVar13 + 1;
        }
        uVar2 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        prVar6->tail_len = uVar2;
        root.ptr = (internal_node<char,_false> *)0x0;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        ref<immutable::rrb_details::tree_node<char,_false>_>::operator=
                  (&prVar6->root,(ref<immutable::rrb_details::tree_node<char,_false>_> *)&root);
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&root);
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                  (&prVar6->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
        release<char>((leaf_node<char,_false> *)new_rrb.ptr);
      }
      else {
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        uVar2 = prVar6->cnt;
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        if (uVar2 - prVar6->tail_len < 0x20) {
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          ptVar11 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->(&prVar6->root);
          uVar14 = 0x20 - ptVar11->len;
          new_rrb.ptr = (rrb<char,_false,_5> *)leaf_node_create<char,false>(0x20);
          if (new_rrb.ptr != (rrb<char,_false,_5> *)0x0) {
            (new_rrb.ptr)->tail_len = 1;
          }
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          root.ptr = (internal_node<char,_false> *)
                     leaf_node_create<char,false>(prVar6->tail_len - uVar14);
          if (root.ptr != (internal_node<char,_false> *)0x0) {
            (root.ptr)->_ref_count = 1;
          }
          uVar13 = 0;
          while( true ) {
            prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
            ptVar11 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->
                                (&prVar6->root);
            if (ptVar11->len <= uVar13) break;
            prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
            cVar1 = *(char *)(*(long *)((prVar6->root).ptr + 1) + uVar13);
            plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
            plVar12->child[uVar13] = cVar1;
            uVar13 = uVar13 + 1;
          }
          for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
            prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
            plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                (&prVar6->tail);
            cVar1 = plVar12->child[uVar13];
            plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
            pcVar5 = plVar12->child;
            prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
            ptVar11 = ref<immutable::rrb_details::tree_node<char,_false>_>::operator->
                                (&prVar6->root);
            pcVar5[ptVar11->len + (int)uVar13] = cVar1;
          }
          uVar13 = 0;
          while( true ) {
            prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
            uVar2 = prVar6->tail_len;
            prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
            if (uVar2 - uVar14 <= uVar13) break;
            plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                (&prVar6->tail);
            cVar1 = plVar12->child[uVar14 + (int)uVar13];
            plVar12 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&root);
            plVar12->child[uVar13] = cVar1;
            uVar13 = uVar13 + 1;
          }
          uVar2 = prVar6->tail_len;
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          prVar6->tail_len = uVar2 - uVar14;
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
                    (&prVar6->tail,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&root);
          prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          ref<immutable::rrb_details::tree_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::tree_node<char,false>> *)&prVar6->root,
                     (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_rrb);
          release<char>((leaf_node<char,_false> *)root.ptr);
          release<char>((leaf_node<char,_false> *)new_rrb.ptr);
        }
      }
    }
    prVar6 = in->ptr;
    *(rrb<char,_false,_5> **)this = prVar6;
    if (prVar6 != (rrb<char,_false,_5> *)0x0) {
      prVar6->_ref_count = prVar6->_ref_count + 1;
    }
  }
  else {
    rrb_create<char,false,5>();
  }
  return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_left(ref<rrb<T, atomic_ref_counting, N>> in, uint32_t left)
      {
      using namespace rrb_details;
      if (left >= in->cnt)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (left > 0)
        {
        const uint32_t remaining = in->cnt - left;

        // If we slice into the tail, we just need to modify the tail itself
        if (remaining <= in->tail_len)
          {
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(remaining);
          //memcpy(new_tail->child, &in->tail->child[in->tail_len - remaining], remaining * sizeof(T));
          for (uint32_t i = 0; i < remaining; ++i)
            new_tail->child[i] = in->tail->child[in->tail_len - remaining + i]; // don't memcpy, but use copy constructor

          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
          new_rrb->cnt = remaining;
          new_rrb->tail_len = remaining;
          new_rrb->tail = new_tail;
          return new_rrb;
          }
        // Otherwise, we don't really have to take the tail into consideration.
        // Good!

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<internal_node<T, atomic_ref_counting>> root = rrb_drop_left_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, left, in->shift, false);
        new_rrb->cnt = remaining;
        new_rrb->root = root;

        // Ensure last element in size table is correct size, if the root is an
        // internal node.
        if (new_rrb->shift != 0 && root->size_table.ptr != nullptr)
          {
          root->size_table->size[root->len - 1] = new_rrb->cnt - in->tail_len;
          }
        new_rrb->tail = in->tail;
        new_rrb->tail_len = in->tail_len;
        in = new_rrb;
        }

      // TODO: I think the code below also applies to root nodes where size_table
      // == NULL and (cnt - tail_len) & 0xff != 0, but it may be that this is
      // resolved by rrb_drop_right itself. Perhaps not promote in the right slicing,
      // but here instead?

      // This case handles leaf nodes < RRB_BRANCHING size, by redistributing
      // values from the tail into the actual leaf node.
      if (in->shift == 0 && in->root.ptr != nullptr)
        {
        // two cases to handle: cnt <= RRB_BRANCHING
        //     and (cnt - tail_len) < RRB_BRANCHING

        if (in->cnt <= bits<N>::rrb_branching)
          {
          // can put all into a new tail
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(in->cnt);
          //memcpy(&new_tail->child[0], &((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[0], in->root->len * sizeof(T));
          for (uint32_t i = 0; i < in->root->len; ++i)
            new_tail->child[i] = ((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_tail->child[in->root->len], &in->tail->child[0], in->tail_len * sizeof(T));
          for (uint32_t i = 0; i < in->tail_len; ++i)
            new_tail->child[in->root->len + i] = in->tail->child[i]; // don't memcpy, but use copy constructor
          in->tail_len = in->cnt;
          in->root = ref<tree_node<T, atomic_ref_counting>>(nullptr);
          in->tail = new_tail;
          }
        // no need for <= here, because if the root node is == rrb_branching, the
        // invariant is kept.
        else if (in->cnt - in->tail_len < bits<N>::rrb_branching)
          {
          // create both a new tail and a new root node
          const uint32_t tail_cut = bits<N>::rrb_branching - in->root->len;
          ref<leaf_node<T, atomic_ref_counting>> new_root = leaf_node_create<T, atomic_ref_counting>(bits<N>::rrb_branching);
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(in->tail_len - tail_cut);

          //memcpy(&new_root->child[0], &((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[0], in->root->len * sizeof(T));
          for (uint32_t i = 0; i < in->root->len; ++i)
            new_root->child[i] = ((leaf_node<T, atomic_ref_counting> *)in->root.ptr)->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_root->child[in->root->len], &in->tail->child[0], tail_cut * sizeof(T));
          for (uint32_t i = 0; i < tail_cut; ++i)
            new_root->child[in->root->len + i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          //memcpy(&new_tail->child[0], &in->tail->child[tail_cut], (in->tail_len - tail_cut) * sizeof(T));
          for (uint32_t i = 0; i < (in->tail_len - tail_cut); ++i)
            new_tail->child[i] = in->tail->child[tail_cut + i]; // don't memcpy, but use copy constructor

          in->tail_len = in->tail_len - tail_cut;
          in->tail = new_tail;
          in->root = new_root;
          }
        }
      return in;
      }